

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop_x86.cpp
# Opt level: O3

int __thiscall ncnn::Crop_x86::forward(Crop_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  void *__ptr;
  Allocator *pAVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined1 uVar12;
  undefined8 uVar13;
  int *piVar20;
  int iVar21;
  ulong uVar22;
  int iVar23;
  ulong uVar24;
  int *piVar25;
  int iVar26;
  size_t sVar27;
  uint uVar28;
  Option *pOVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  int iVar33;
  int _outw;
  Mat m;
  int _outh;
  int _woffset;
  int _outc;
  int _outd;
  int _hoffset;
  size_t local_f8;
  Option *local_f0;
  Mat m_1;
  int _coffset;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  ulong local_88;
  int _doffset;
  Mat m_2;
  undefined4 uVar7;
  undefined3 uVar9;
  undefined2 uVar11;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined3 uVar16;
  undefined1 uVar17;
  undefined2 uVar18;
  undefined1 uVar19;
  
  m.c = bottom_blob->c;
  uVar22 = (ulong)(uint)m.c;
  iVar23 = bottom_blob->dims;
  iVar26 = bottom_blob->w;
  iVar32 = bottom_blob->h;
  iVar33 = bottom_blob->d;
  sVar27 = bottom_blob->elemsize;
  iVar21 = bottom_blob->elempack;
  m.elempack = iVar21;
  if (iVar21 != 4) goto LAB_0028b174;
  uVar28 = iVar23 - 1;
  m.w = iVar26;
  m.h = iVar32;
  switch(uVar28) {
  case 0:
    m.w = iVar26 << 2;
    m.dims = 1;
    m.h = 1;
    m.c = 1;
    m.cstep = (size_t)m.w;
    break;
  case 1:
    m.h = iVar32 << 2;
    m.dims = 2;
    m.c = 1;
    m.cstep = (long)m.h * (long)iVar26;
    break;
  case 2:
    m.c = m.c * 4;
    m.dims = 3;
    m.cstep = (long)iVar32 * (long)iVar26 + 3U & 0x3ffffffffffffffc;
    break;
  case 3:
    m.c = m.c * 4;
    m.elemsize = 4;
    m.elempack = 1;
    m.dims = 4;
    m.cstep = (long)iVar33 * (long)iVar32 * (long)iVar26 + 3U & 0x3ffffffffffffffc;
    m.d = iVar33;
    goto LAB_0028ab17;
  default:
    m.cstep = 0;
    m.elemsize = 0;
    m.elempack = 0;
    m.dims = 0;
    m.w = 0;
    m.h = 0;
    m.d = 0;
    m.c = 0;
    goto LAB_0028ab17;
  }
  m.d = 1;
  m.elempack = 1;
  m.elemsize = 4;
LAB_0028ab17:
  m.allocator = (Allocator *)0x0;
  m.refcount._4_4_ = 0;
  m.refcount._0_4_ = 0;
  m.data = (void *)0x0;
  piVar25 = &_doffset;
  local_f8 = sVar27;
  local_f0 = opt;
  local_98 = iVar23;
  iStack_94 = iVar26;
  iStack_90 = iVar32;
  iStack_8c = iVar33;
  local_88 = uVar22;
  Crop::resolve_crop_roi
            ((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),&m,&_woffset,
             &_hoffset,piVar25,&_coffset,&_outw,&_outh,&_outd,&_outc);
  piVar20 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar20 != (int *)0x0) {
    LOCK();
    *piVar20 = *piVar20 + -1;
    UNLOCK();
    if (*piVar20 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  pOVar29 = local_f0;
  if (3 < uVar28) goto LAB_0028b15d;
  iVar23 = _outc >> 2;
  switch(uVar28) {
  case 0:
    uVar28 = _outw & 3;
    iVar23 = (uint)(uVar28 == 0) * 3 + 1;
    uVar22 = (long)_outw % (long)iVar23;
    if (iStack_94 == _outw / iVar23 && uVar28 == 0) {
      if (top_blob == bottom_blob) {
        return 0;
      }
      piVar25 = bottom_blob->refcount;
      if (piVar25 != (int *)0x0) {
        LOCK();
        *piVar25 = *piVar25 + 1;
        UNLOCK();
      }
      piVar25 = top_blob->refcount;
      if (piVar25 == (int *)0x0) goto LAB_0028b2e3;
      LOCK();
      *piVar25 = *piVar25 + -1;
      UNLOCK();
      if (*piVar25 != 0) goto LAB_0028b2e3;
      __ptr = top_blob->data;
      pAVar1 = top_blob->allocator;
joined_r0x0028add6:
      if (pAVar1 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (*pAVar1->_vptr_Allocator[3])(pAVar1,__ptr,uVar22 & 0xffffffff);
      }
LAB_0028b2e3:
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      piVar25 = bottom_blob->refcount;
      top_blob->data = bottom_blob->data;
      top_blob->refcount = piVar25;
      top_blob->elemsize = bottom_blob->elemsize;
      top_blob->elempack = bottom_blob->elempack;
      top_blob->allocator = bottom_blob->allocator;
      iVar21 = bottom_blob->w;
      iVar23 = bottom_blob->h;
      iVar26 = bottom_blob->d;
      top_blob->dims = bottom_blob->dims;
      top_blob->w = iVar21;
      top_blob->h = iVar23;
      top_blob->d = iVar26;
      top_blob->c = bottom_blob->c;
      top_blob->cstep = bottom_blob->cstep;
      return 0;
    }
    if (((_outw | _woffset) & 3U) == 0) {
      Mat::create(top_blob,_outw / iVar23,(local_f8 >> 2) << (uVar28 == 0) * '\x02',iVar23,
                  local_f0->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar21 = _woffset + 3;
      if (-1 < _woffset) {
        iVar21 = _woffset;
      }
      crop_pack4_sse(bottom_blob,top_blob,0,iVar21 >> 2);
      return 0;
    }
    break;
  case 1:
    if (_outw == iStack_94) {
      iVar23 = (uint)((_outh & 3U) == 0) * 3 + 1;
      uVar22 = (long)_outh % (long)iVar23;
      if (((_outh & 3U) == 0) && (_outh / iVar23 == iStack_90)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar25 = bottom_blob->refcount;
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + 1;
          UNLOCK();
        }
        piVar25 = top_blob->refcount;
        if (piVar25 == (int *)0x0) goto LAB_0028b2e3;
        LOCK();
        *piVar25 = *piVar25 + -1;
        UNLOCK();
        if (*piVar25 != 0) goto LAB_0028b2e3;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x0028add6;
      }
    }
    if (((_hoffset | _outh) & 3U) == 0) {
      Mat::create(top_blob,_outw,_outh >> 2,(local_f8 >> 2) << ((_outh & 3U) == 0) * '\x02',4,
                  local_f0->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      iVar21 = _hoffset + 3;
      if (-1 < _hoffset) {
        iVar21 = _hoffset;
      }
      crop_pack4_sse(bottom_blob,top_blob,iVar21 >> 2,_woffset);
      return 0;
    }
    break;
  case 2:
    sVar27 = (local_f8 >> 2) << ((_outc & 3U) == 0) * '\x02';
    if (iStack_90 == _outh && iStack_94 == _outw) {
      iVar26 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar22 = (long)_outc % (long)iVar26;
      if (((_outc & 3U) == 0) && (_outc / iVar26 == (int)local_88)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar25 = bottom_blob->refcount;
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + 1;
          UNLOCK();
        }
        piVar25 = top_blob->refcount;
        if (piVar25 == (int *)0x0) goto LAB_0028b2e3;
        LOCK();
        *piVar25 = *piVar25 + -1;
        UNLOCK();
        if (*piVar25 != 0) goto LAB_0028b2e3;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x0028add6;
      }
    }
    if (((_coffset | _outc) & 3U) != 0) break;
    m.w = bottom_blob->w;
    m.h = bottom_blob->h;
    m.d = bottom_blob->d;
    m.elemsize = bottom_blob->elemsize;
    m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * m.elemsize +
                     (long)bottom_blob->data);
    m.elempack = bottom_blob->elempack;
    m.allocator = bottom_blob->allocator;
    m.refcount._0_4_ = 0;
    m.refcount._4_4_ = 0;
    m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
              m.elemsize;
    m.dims = bottom_blob->dims;
    m.c = iVar23;
    if (iStack_90 != _outh || iStack_94 != _outw) {
LAB_0028b42c:
      iVar21 = _outc + 3;
      if (-1 < _outc) {
        iVar21 = _outc;
      }
      Mat::create(top_blob,_outw,_outh,iVar21 >> 2,sVar27,4,pOVar29->blob_allocator);
      iVar21 = -100;
      if ((top_blob->data != (void *)0x0) && (top_blob->cstep * (long)top_blob->c != 0)) {
        if (0 < top_blob->c) {
          lVar30 = 0;
          do {
            m_1.data = (void *)(m.cstep * lVar30 * m.elemsize + (long)m.data);
            m_1.refcount = (int *)0x0;
            m_1.elemsize = m.elemsize;
            m_1.elempack = m.elempack;
            m_1.allocator = m.allocator;
            m_1.h = m.h;
            m_1.d = 1;
            m_1.c = m.d;
            m_1.w = m.w;
            m_1.dims = m.dims + -1;
            m_1.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize
            ;
            if (m.dims == 4) {
              m_1.cstep = (long)m.h * (long)m.w;
            }
            m_2.w = top_blob->w;
            m_2.h = top_blob->h;
            m_2.elemsize = top_blob->elemsize;
            m_2.data = (void *)(top_blob->cstep * lVar30 * m_2.elemsize + (long)top_blob->data);
            m_2.elempack = top_blob->elempack;
            m_2.allocator = top_blob->allocator;
            m_2.refcount = (int *)0x0;
            m_2.c = top_blob->d;
            m_2.d = 1;
            m_2.dims = top_blob->dims + -1;
            m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                        m_2.elemsize;
            if (top_blob->dims == 4) {
              m_2.cstep = (long)m_2.h * (long)m_2.w;
            }
            crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
            lVar30 = lVar30 + 1;
          } while (lVar30 < top_blob->c);
        }
        iVar21 = 0;
      }
    }
    else {
      Mat::clone(&m_1,(__fn *)&m,(void *)0x0,(int)sVar27,(void *)(ulong)(uint)_outh);
      if (&m_1 != top_blob) {
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + 1;
          UNLOCK();
        }
        piVar25 = top_blob->refcount;
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + -1;
          UNLOCK();
          if (*piVar25 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = m_1.data;
        top_blob->refcount = m_1.refcount;
        top_blob->elemsize = m_1.elemsize;
        top_blob->elempack = m_1.elempack;
        top_blob->allocator = m_1.allocator;
        top_blob->dims = m_1.dims;
        top_blob->w = m_1.w;
        top_blob->h = m_1.h;
        top_blob->d = m_1.d;
        top_blob->c = m_1.c;
        top_blob->cstep = m_1.cstep;
      }
      if (m_1.refcount != (int *)0x0) {
        LOCK();
        *m_1.refcount = *m_1.refcount + -1;
        UNLOCK();
        if (*m_1.refcount == 0) {
          if (m_1.allocator == (Allocator *)0x0) {
            if (m_1.data != (void *)0x0) {
              free(m_1.data);
            }
          }
          else {
            (*(m_1.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar21 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
      goto LAB_0028b42c;
    }
    piVar25 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
    if (piVar25 == (int *)0x0) {
      return iVar21;
    }
    LOCK();
    *piVar25 = *piVar25 + -1;
    UNLOCK();
    if (*piVar25 != 0) {
      return iVar21;
    }
    if (m.allocator != (Allocator *)0x0) {
      (*(m.allocator)->_vptr_Allocator[3])();
      return iVar21;
    }
joined_r0x0028b972:
    m.allocator = (Allocator *)0x0;
    if (m.data == (void *)0x0) {
      return iVar21;
    }
    goto LAB_0028b257;
  case 3:
    sVar27 = (local_f8 >> 2) << ((_outc & 3U) == 0) * '\x02';
    bVar2 = iStack_94 == _outd;
    bVar3 = iStack_90 == _outh;
    bVar4 = iStack_94 == _outw;
    if (bVar2 && (bVar3 && bVar4)) {
      iVar26 = (uint)((_outc & 3U) == 0) * 3 + 1;
      uVar22 = (long)_outc % (long)iVar26;
      if (((_outc & 3U) == 0) && (_outc / iVar26 == (int)local_88)) {
        if (top_blob == bottom_blob) {
          return 0;
        }
        piVar25 = bottom_blob->refcount;
        if (piVar25 != (int *)0x0) {
          LOCK();
          *piVar25 = *piVar25 + 1;
          UNLOCK();
        }
        piVar25 = top_blob->refcount;
        if (piVar25 == (int *)0x0) goto LAB_0028b2e3;
        LOCK();
        *piVar25 = *piVar25 + -1;
        UNLOCK();
        if (*piVar25 != 0) goto LAB_0028b2e3;
        __ptr = top_blob->data;
        pAVar1 = top_blob->allocator;
        goto joined_r0x0028add6;
      }
    }
    local_f8 = sVar27;
    if (((_coffset | _outc) & 3U) == 0) {
      m.w = bottom_blob->w;
      m.h = bottom_blob->h;
      m.d = bottom_blob->d;
      m.elemsize = bottom_blob->elemsize;
      m.data = (void *)((long)(_coffset >> 2) * bottom_blob->cstep * m.elemsize +
                       (long)bottom_blob->data);
      m.elempack = bottom_blob->elempack;
      m.allocator = bottom_blob->allocator;
      m.refcount._0_4_ = 0;
      m.refcount._4_4_ = 0;
      m.cstep = ((long)m.d * m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) /
                m.elemsize;
      m.dims = bottom_blob->dims;
      m.c = iVar23;
      if (bVar2 && (bVar3 && bVar4)) {
        Mat::clone(&m_1,(__fn *)&m,(void *)0x0,_outd,
                   (void *)CONCAT71((int7)((ulong)piVar25 >> 8),bVar2 && (bVar3 && bVar4)));
        pOVar29 = local_f0;
        sVar27 = local_f8;
        if (&m_1 != top_blob) {
          if (m_1.refcount != (int *)0x0) {
            LOCK();
            *m_1.refcount = *m_1.refcount + 1;
            UNLOCK();
          }
          piVar25 = top_blob->refcount;
          if (piVar25 != (int *)0x0) {
            LOCK();
            *piVar25 = *piVar25 + -1;
            UNLOCK();
            if (*piVar25 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->data = m_1.data;
          top_blob->refcount = m_1.refcount;
          top_blob->elemsize = m_1.elemsize;
          top_blob->elempack = m_1.elempack;
          top_blob->allocator = m_1.allocator;
          top_blob->dims = m_1.dims;
          top_blob->w = m_1.w;
          top_blob->h = m_1.h;
          top_blob->d = m_1.d;
          top_blob->c = m_1.c;
          top_blob->cstep = m_1.cstep;
        }
        if (m_1.refcount != (int *)0x0) {
          LOCK();
          *m_1.refcount = *m_1.refcount + -1;
          UNLOCK();
          if (*m_1.refcount == 0) {
            if (m_1.allocator == (Allocator *)0x0) {
              if (m_1.data != (void *)0x0) {
                free(m_1.data);
              }
            }
            else {
              (*(m_1.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar21 = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0))
        goto LAB_0028b74c;
      }
      else {
LAB_0028b74c:
        iVar21 = _outc + 3;
        if (-1 < _outc) {
          iVar21 = _outc;
        }
        Mat::create(top_blob,_outw,_outh,_outd,iVar21 >> 2,sVar27,4,pOVar29->blob_allocator);
        iVar21 = -100;
        if (top_blob->data != (void *)0x0) {
          uVar22 = (ulong)top_blob->c;
          if (top_blob->cstep * uVar22 != 0) {
            if (0 < top_blob->c) {
              uVar24 = (ulong)(uint)_outd;
              lVar30 = 0;
              do {
                if (0 < (int)uVar24) {
                  lVar31 = 0;
                  do {
                    m_1.cstep = (long)m.h * (long)m.w;
                    m_1.data = (void *)((long)m.data +
                                       (long)(_doffset + (int)lVar31) * m.elemsize * m_1.cstep +
                                       m.cstep * lVar30 * m.elemsize);
                    m_1.refcount = (int *)0x0;
                    m_1.elemsize = m.elemsize;
                    m_1.elempack = m.elempack;
                    m_1.allocator = m.allocator;
                    m_1.w = m.w;
                    m_1.dims = 2;
                    m_1.h = m.h;
                    m_1.d = 1;
                    m_1.c = 1;
                    m_2.w = top_blob->w;
                    m_2.h = top_blob->h;
                    m_2.elemsize = top_blob->elemsize;
                    m_2.elempack = top_blob->elempack;
                    m_2.allocator = top_blob->allocator;
                    m_2.cstep = (long)m_2.h * (long)m_2.w;
                    m_2.data = (void *)((long)top_blob->data +
                                       lVar31 * m_2.elemsize * m_2.cstep +
                                       top_blob->cstep * lVar30 * m_2.elemsize);
                    m_2.refcount = (int *)0x0;
                    m_2.dims = 2;
                    m_2.d = 1;
                    m_2.c = 1;
                    crop_pack4_sse(&m_1,&m_2,_hoffset,_woffset);
                    uVar24 = (ulong)_outd;
                    lVar31 = lVar31 + 1;
                  } while (lVar31 < (long)uVar24);
                  uVar22 = (ulong)(uint)top_blob->c;
                }
                lVar30 = lVar30 + 1;
              } while (lVar30 < (int)uVar22);
            }
            iVar21 = 0;
          }
        }
      }
      piVar25 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
      if (piVar25 == (int *)0x0) {
        return iVar21;
      }
      LOCK();
      *piVar25 = *piVar25 + -1;
      UNLOCK();
      if (*piVar25 != 0) {
        return iVar21;
      }
      if (m.allocator != (Allocator *)0x0) {
        (*(m.allocator)->_vptr_Allocator[3])();
        return iVar21;
      }
      goto joined_r0x0028b972;
    }
  }
LAB_0028b15d:
  sVar27 = bottom_blob->elemsize;
  iVar23 = bottom_blob->dims;
  iVar26 = bottom_blob->w;
  iVar32 = bottom_blob->h;
  iVar33 = bottom_blob->d;
  m.c = bottom_blob->c;
  opt = local_f0;
  m.elempack = bottom_blob->elempack;
LAB_0028b174:
  m.data = bottom_blob->data;
  piVar25 = bottom_blob->refcount;
  m.refcount._0_4_ = SUB84(piVar25,0);
  m.refcount._4_4_ = (undefined4)((ulong)piVar25 >> 0x20);
  m.allocator = bottom_blob->allocator;
  m.cstep = bottom_blob->cstep;
  if (piVar25 != (int *)0x0) {
    LOCK();
    *piVar25 = *piVar25 + 1;
    UNLOCK();
  }
  m.elemsize = sVar27;
  m.dims = iVar23;
  m.w = iVar26;
  m.h = iVar32;
  m.d = iVar33;
  if (iVar21 != 1) {
    m_1.data = *(void **)opt;
    m_1.elemsize = (size_t)opt->workspace_allocator;
    m_1.elempack = opt->openmp_blocktime;
    m_1._28_1_ = opt->use_winograd_convolution;
    m_1._29_1_ = opt->use_sgemm_convolution;
    m_1._30_1_ = opt->use_int8_inference;
    m_1._31_1_ = opt->use_vulkan_compute;
    m_1.allocator = *(Allocator **)&opt->use_bf16_storage;
    m_1._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    uVar5 = opt->flush_denormals;
    uVar6 = opt->use_local_pool_allocator;
    uVar8 = opt->use_shader_local_memory;
    uVar10 = opt->use_cooperative_matrix;
    uVar12 = opt->use_winograd23_convolution;
    uVar11 = CONCAT11(uVar12,uVar10);
    uVar9 = CONCAT21(uVar11,uVar8);
    uVar7 = CONCAT31(uVar9,uVar6);
    uVar13._0_1_ = opt->use_winograd43_convolution;
    uVar13._1_1_ = opt->use_winograd63_convolution;
    uVar13._2_1_ = opt->use_reserved_6;
    uVar13._3_1_ = opt->use_reserved_7;
    uVar14 = opt->use_reserved_8;
    uVar15 = opt->use_reserved_9;
    uVar17 = opt->use_reserved_10;
    uVar19 = opt->use_reserved_11;
    uVar18 = CONCAT11(uVar19,uVar17);
    uVar16 = CONCAT21(uVar18,uVar15);
    uVar13._4_4_ = CONCAT31(uVar16,uVar14);
    m_1.c = (int)uVar13;
    m_1.refcount = (int *)opt->workspace_allocator;
    m_1.h = uVar5;
    m_1.d = uVar7;
    m_1._60_4_ = uVar13._4_4_;
    convert_packing(bottom_blob,&m,1,(Option *)&m_1);
  }
  iVar21 = Crop::forward((Crop *)((long)&this->_vptr_Crop_x86 + (long)this->_vptr_Crop_x86[-3]),&m,
                         top_blob,opt);
  piVar25 = (int *)CONCAT44(m.refcount._4_4_,m.refcount._0_4_);
  if (piVar25 != (int *)0x0) {
    LOCK();
    *piVar25 = *piVar25 + -1;
    UNLOCK();
    if (*piVar25 == 0) {
      if (m.allocator == (Allocator *)0x0) {
        if (m.data != (void *)0x0) {
LAB_0028b257:
          free(m.data);
        }
      }
      else {
        (*(m.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar21;
}

Assistant:

int Crop_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 16 == 0 ? 16 : _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 16 == 0 ? 16 : _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 16 == 0 && out_elempack == 16)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack16_avx512(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 16 == 0 ? 16 : _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 16)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 16 == 0 && out_elempack == 16)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack16_avx512(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX512F__

    if (elempack == 8)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 8 == 0 ? 8 : _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 8 == 0 ? 8 : _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 8 == 0 && out_elempack == 8)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack8_avx(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);
                    crop_pack8_avx(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 8 == 0 ? 8 : _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 8)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 8 == 0 && out_elempack == 8)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);
                        crop_pack8_avx(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __AVX__

    if (elempack == 4)
    {
        int _woffset, _hoffset, _doffset, _coffset;
        int _outw, _outh, _outd, _outc;
        resolve_crop_roi(bottom_blob.shape(), _woffset, _hoffset, _doffset, _coffset, _outw, _outh, _outd, _outc);

        if (dims == 1)
        {
            int out_elempack = _outw % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw / out_elempack == w && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_woffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, 0, _woffset / elempack);

                return 0;
            }
        }

        if (dims == 2)
        {
            int out_elempack = _outh % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh / out_elempack == h && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_hoffset % 4 == 0 && out_elempack == 4)
            {
                top_blob.create(_outw, _outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                crop_pack4_sse(bottom_blob, top_blob, _hoffset / elempack, _woffset);

                return 0;
            }
        }

        if (dims == 3)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    const Mat m = bottom_blob_sliced.channel(q);
                    Mat borderm = top_blob.channel(q);

                    crop_pack4_sse(m, borderm, _hoffset, _woffset);
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int out_elempack = _outc % 4 == 0 ? 4 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (_outw == w && _outh == h && _outd == d && _outc / out_elempack == channels && out_elempack == 4)
            {
                top_blob = bottom_blob;
                return 0;
            }

            if (_coffset % 4 == 0 && out_elempack == 4)
            {
                const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset / out_elempack, _outc / out_elempack);

                if (_outw == w && _outh == h && _outd == d)
                {
                    top_blob = bottom_blob_sliced.clone();
                    if (top_blob.empty())
                        return -100;
                }

                top_blob.create(_outw, _outh, _outd, _outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < top_blob.c; q++)
                {
                    for (int z = 0; z < _outd; z++)
                    {
                        const Mat m = bottom_blob_sliced.channel(q).depth(z + _doffset);
                        Mat borderm = top_blob.channel(q).depth(z);

                        crop_pack4_sse(m, borderm, _hoffset, _woffset);
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Crop::forward(bottom_blob_unpacked, top_blob, opt);
}